

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void bcf_hdr_destroy(bcf_hdr_t *h)

{
  kh_vdict_t *h_00;
  vdict_t *d;
  khint_t k;
  int i;
  bcf_hdr_t *h_local;
  
  for (d._4_4_ = 0; d._4_4_ < 3; d._4_4_ = d._4_4_ + 1) {
    h_00 = (kh_vdict_t *)h->dict[d._4_4_];
    if (h_00 != (kh_vdict_t *)0x0) {
      for (d._0_4_ = 0; (uint)d != h_00->n_buckets; d._0_4_ = (uint)d + 1) {
        if ((h_00->flags[(uint)d >> 4] >> (sbyte)(((uint)d & 0xf) << 1) & 3) == 0) {
          free(h_00->keys[(uint)d]);
        }
      }
      kh_destroy_vdict(h_00);
      free(h->id[d._4_4_]);
    }
  }
  for (d._4_4_ = 0; d._4_4_ < h->nhrec; d._4_4_ = d._4_4_ + 1) {
    bcf_hrec_destroy(h->hrec[d._4_4_]);
  }
  if (h->nhrec != 0) {
    free(h->hrec);
  }
  if (h->samples != (char **)0x0) {
    free(h->samples);
  }
  free(h->keep_samples);
  free(h->transl[0]);
  free(h->transl[1]);
  free((h->mem).s);
  free(h);
  return;
}

Assistant:

void bcf_hdr_destroy(bcf_hdr_t *h)
{
    int i;
    khint_t k;
    for (i = 0; i < 3; ++i) {
        vdict_t *d = (vdict_t*)h->dict[i];
        if (d == 0) continue;
        for (k = kh_begin(d); k != kh_end(d); ++k)
            if (kh_exist(d, k)) free((char*)kh_key(d, k));
        kh_destroy(vdict, d);
        free(h->id[i]);
    }
    for (i=0; i<h->nhrec; i++)
        bcf_hrec_destroy(h->hrec[i]);
    if (h->nhrec) free(h->hrec);
    if (h->samples) free(h->samples);
    free(h->keep_samples);
    free(h->transl[0]); free(h->transl[1]);
    free(h->mem.s);
    free(h);
}